

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O3

int __thiscall ncnn::Layer::forward(Layer *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  void *in_R8;
  Mat local_58;
  
  iVar2 = -1;
  if (this->support_inplace == true) {
    Mat::clone(&local_58,(__fn *)bottom_blob,opt->blob_allocator,(int)opt,in_R8);
    if (&local_58 != top_blob) {
      if (local_58.refcount != (int *)0x0) {
        LOCK();
        *local_58.refcount = *local_58.refcount + 1;
        UNLOCK();
      }
      piVar1 = top_blob->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 8))();
          }
        }
      }
      top_blob->data = local_58.data;
      top_blob->refcount = local_58.refcount;
      top_blob->elemsize = local_58.elemsize;
      top_blob->allocator = local_58.allocator;
      top_blob->dims = local_58.dims;
      top_blob->w = local_58.w;
      top_blob->h = local_58.h;
      top_blob->c = local_58.c;
      top_blob->cstep = local_58.cstep;
    }
    if (local_58.refcount != (int *)0x0) {
      LOCK();
      *local_58.refcount = *local_58.refcount + -1;
      UNLOCK();
      if (*local_58.refcount == 0) {
        if (local_58.allocator == (Allocator *)0x0) {
          if (local_58.data != (void *)0x0) {
            free(*(void **)((long)local_58.data + -8));
          }
        }
        else {
          (**(code **)(*(long *)local_58.allocator + 8))();
        }
      }
    }
    iVar2 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar2 = (*this->_vptr_Layer[7])(this,top_blob,opt);
    }
  }
  return iVar2;
}

Assistant:

int Layer::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (!support_inplace)
        return -1;

    top_blob = bottom_blob.clone(opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    return forward_inplace(top_blob, opt);
}